

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::GetFirstLoopInvariantOperand
          (LoopPeelingInfo *this,Instruction *condition)

{
  IRContext *this_00;
  Loop *pLVar1;
  Instruction *this_01;
  bool bVar2;
  uint32_t uVar3;
  undefined8 in_RAX;
  BasicBlock *pBVar4;
  size_type sVar5;
  uint32_t unaff_EBP;
  uint uVar6;
  uint uVar7;
  undefined8 uStack_38;
  
  uVar6 = (condition->has_result_id_ & 1) + 1;
  if (condition->has_type_id_ == false) {
    uVar6 = (uint)condition->has_result_id_;
  }
  if (uVar6 != (int)((ulong)((long)(condition->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(condition->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
    uVar7 = 0;
    uStack_38 = in_RAX;
    do {
      this_00 = this->context_;
      uVar3 = Instruction::GetSingleWordOperand(condition,uVar6 + uVar7);
      pBVar4 = IRContext::get_instr_block(this_00,uVar3);
      bVar2 = true;
      if (pBVar4 != (BasicBlock *)0x0) {
        pLVar1 = this->loop_;
        this_01 = (pBVar4->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar3 = 0;
        if (this_01->has_result_id_ == true) {
          uVar3 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
        }
        uStack_38 = CONCAT44(uVar3,(undefined4)uStack_38);
        sVar5 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&(pLVar1->loop_basic_blocks_)._M_h,
                        (key_type_conflict *)((long)&uStack_38 + 4));
        if (sVar5 != 0) {
          uVar6 = (condition->has_result_id_ & 1) + 1;
          if (condition->has_type_id_ == false) {
            uVar6 = (uint)condition->has_result_id_;
          }
          unaff_EBP = Instruction::GetSingleWordOperand(condition,uVar6 + uVar7);
          bVar2 = false;
        }
      }
      if (!bVar2) {
        return unaff_EBP;
      }
      uVar7 = uVar7 + 1;
      uVar6 = (condition->has_result_id_ & 1) + 1;
      if (condition->has_type_id_ == false) {
        uVar6 = (uint)condition->has_result_id_;
      }
    } while (uVar7 < (int)((ulong)((long)(condition->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(condition->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - uVar6);
  }
  return 0;
}

Assistant:

uint32_t LoopPeelingPass::LoopPeelingInfo::GetFirstLoopInvariantOperand(
    Instruction* condition) const {
  for (uint32_t i = 0; i < condition->NumInOperands(); i++) {
    BasicBlock* bb =
        context_->get_instr_block(condition->GetSingleWordInOperand(i));
    if (bb && loop_->IsInsideLoop(bb)) {
      return condition->GetSingleWordInOperand(i);
    }
  }

  return 0;
}